

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TriangularMatrix.h
# Opt level: O2

void Eigen::internal::
     triangular_assignment_loop<Eigen::internal::triangular_dense_assignment_kernel<1,_0,_1,_Eigen::internal::evaluator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>,_Eigen::internal::evaluator<Eigen::TriangularView<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1U>_>,_Eigen::internal::assign_op<double,_double>,_0>,_1U,_-1,_true>
     ::run(triangular_dense_assignment_kernel<1,_0,_1,_Eigen::internal::evaluator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_Eigen::internal::evaluator<Eigen::TriangularView<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1U>_>,_Eigen::internal::assign_op<double,_double>,_0>
           *kernel)

{
  long lVar1;
  DstEvaluatorType *pDVar2;
  DstXprType *pDVar3;
  long lVar4;
  long lVar5;
  long col;
  long id;
  
  pDVar3 = (kernel->
           super_generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_Eigen::internal::evaluator<Eigen::TriangularView<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1U>_>,_Eigen::internal::assign_op<double,_double>,_0>
           ).m_dstExpr;
  lVar5 = 0;
  for (col = 0; col < (pDVar3->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
                      m_storage.m_cols; col = col + 1) {
    lVar1 = (pDVar3->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
            m_rows;
    pDVar2 = (kernel->
             super_generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_Eigen::internal::evaluator<Eigen::TriangularView<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1U>_>,_Eigen::internal::assign_op<double,_double>,_0>
             ).m_dst;
    id = col;
    if (lVar1 < col) {
      id = lVar1;
    }
    if (id < 1) {
      id = 0;
    }
    for (lVar4 = 0; id != lVar4; lVar4 = lVar4 + 1) {
      *(undefined8 *)
       ((long)(pDVar2->
              super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>).
              m_data +
       lVar4 * 8 +
       (pDVar2->super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>)
       .m_outerStride.m_value * lVar5) = 0;
    }
    lVar4 = id;
    if (id < lVar1) {
      lVar4 = id + 1;
      triangular_dense_assignment_kernel<1,_0,_1,_Eigen::internal::evaluator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>,_Eigen::internal::evaluator<Eigen::TriangularView<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1U>_>,_Eigen::internal::assign_op<double,_double>,_0>
      ::assignDiagonalCoeff(kernel,id);
    }
    for (; pDVar3 = (kernel->
                    super_generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_Eigen::internal::evaluator<Eigen::TriangularView<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1U>_>,_Eigen::internal::assign_op<double,_double>,_0>
                    ).m_dstExpr,
        lVar4 < (pDVar3->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage
                .m_rows; lVar4 = lVar4 + 1) {
      generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>,_Eigen::internal::evaluator<Eigen::TriangularView<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1U>_>,_Eigen::internal::assign_op<double,_double>,_0>
      ::assignCoeff(&kernel->
                     super_generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_Eigen::internal::evaluator<Eigen::TriangularView<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1U>_>,_Eigen::internal::assign_op<double,_double>,_0>
                    ,lVar4,col);
    }
    lVar5 = lVar5 + 8;
  }
  return;
}

Assistant:

EIGEN_DEVICE_FUNC
  static inline void run(Kernel &kernel)
  {
    for(Index j = 0; j < kernel.cols(); ++j)
    {
      Index maxi = numext::mini(j, kernel.rows());
      Index i = 0;
      if (((Mode&Lower) && SetOpposite) || (Mode&Upper))
      {
        for(; i < maxi; ++i)
          if(Mode&Upper) kernel.assignCoeff(i, j);
          else           kernel.assignOppositeCoeff(i, j);
      }
      else
        i = maxi;
      
      if(i<kernel.rows()) // then i==j
        kernel.assignDiagonalCoeff(i++);
      
      if (((Mode&Upper) && SetOpposite) || (Mode&Lower))
      {
        for(; i < kernel.rows(); ++i)
          if(Mode&Lower) kernel.assignCoeff(i, j);
          else           kernel.assignOppositeCoeff(i, j);
      }
    }
  }